

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

optional<pbrt::LightLeSample> * __thiscall
pbrt::DiffuseAreaLight::SampleLe
          (DiffuseAreaLight *this,Point2f u1,Point2f u2,SampledWavelengths *lambda,Float time)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Point2f u;
  Point2f u_00;
  Point2f u_01;
  undefined1 auVar3 [16];
  Normal3f z;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Vector3f v;
  bool bVar8;
  ShapeSample *pSVar9;
  float *pfVar10;
  LightLeSample *v_00;
  optional<pbrt::LightLeSample> *this_00;
  long in_RSI;
  int __x;
  optional<pbrt::LightLeSample> *in_RDI;
  Tuple2<pbrt::Point2,_float> *pTVar11;
  float fVar12;
  Float FVar13;
  undefined8 uVar14;
  LightLeSample *this_01;
  undefined1 in_ZMM0 [64];
  undefined8 uVar15;
  undefined1 in_ZMM1 [64];
  Float in_XMM2_Da;
  Vector3f VVar16;
  Tuple3<pbrt::Vector3,_float> TVar17;
  Point3f PVar18;
  SampledSpectrum SVar19;
  SampledSpectrum Le;
  Frame nFrame;
  Interaction *intr;
  Float pdfDir;
  Vector3f w;
  optional<pbrt::ShapeSample> ss;
  Shape *in_stack_fffffffffffffb30;
  Point2f in_stack_fffffffffffffb38;
  undefined4 uStack_4b0;
  float in_stack_fffffffffffffb54;
  float in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb70;
  Float FVar20;
  undefined4 in_stack_fffffffffffffb74;
  Interaction *in_stack_fffffffffffffb78;
  float in_stack_fffffffffffffb80;
  Interaction *in_stack_fffffffffffffbd8;
  float *in_stack_fffffffffffffbf0;
  float in_stack_fffffffffffffbf8;
  Interaction *in_stack_fffffffffffffc10;
  DiffuseAreaLight *in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc68;
  float fVar21;
  SampledWavelengths *in_stack_fffffffffffffcc0;
  DiffuseAreaLight *in_stack_fffffffffffffcc8;
  Tuple3<pbrt::Vector3,_float> in_stack_fffffffffffffce4;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffffcf0;
  Tuple3<pbrt::Normal3,_float> in_stack_fffffffffffffd08;
  Tuple3<pbrt::Point3,_float> in_stack_fffffffffffffd28;
  float local_ec;
  undefined8 local_e8;
  float local_e0;
  Tuple2<pbrt::Point2,_float> local_d8;
  undefined8 local_cc;
  float local_c4;
  float local_c0;
  float local_bc;
  undefined8 local_b8;
  float local_b0;
  undefined4 local_a8;
  undefined8 local_98;
  optional local_90 [100];
  Float local_2c;
  Tuple2<pbrt::Point2,_float> local_18;
  undefined8 local_10;
  
  local_98 = vmovlpd_avx(in_ZMM0._0_16_);
  local_18 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(in_ZMM1._0_16_);
  local_2c = in_XMM2_Da;
  local_10 = local_98;
  Shape::Sample(in_stack_fffffffffffffb30,in_stack_fffffffffffffb38);
  bVar8 = pstd::optional::operator_cast_to_bool(local_90);
  if (bVar8) {
    pSVar9 = pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x6be0be);
    fVar21 = SUB84(pSVar9,0);
    (pSVar9->intr).time = local_2c;
    pSVar9 = pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x6be101);
    (pSVar9->intr).mediumInterface = (MediumInterface *)(in_RSI + 0x88);
    pSVar9 = pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x6be12c);
    bVar8 = AlphaMasked(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
    if (bVar8) {
      memset(in_RDI,0,0xa0);
      pstd::optional<pbrt::LightLeSample>::optional(in_RDI);
    }
    else {
      Vector3<float>::Vector3((Vector3<float> *)0x6be19f);
      if ((*(byte *)(in_RSI + 0xac) & 1) == 0) {
        uVar14 = 0;
        u_01.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffb58;
        u_01.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffb54;
        VVar16 = SampleCosineHemisphere(u_01);
        local_b0 = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar5._8_8_ = uVar14;
        auVar5._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_b8 = vmovlpd_avx(auVar5);
        local_bc = CosineHemispherePDF(local_b0);
      }
      else {
        pfVar10 = Tuple2<pbrt::Point2,_float>::operator[](&local_18,0);
        if (0.5 <= *pfVar10) {
          pfVar10 = Tuple2<pbrt::Point2,_float>::operator[](&local_18,0);
          in_stack_fffffffffffffbf8 = SUB84(pfVar10,0);
          local_ec = *pfVar10 + -0.5 + *pfVar10 + -0.5;
          in_stack_fffffffffffffbf0 = std::min<float>(&local_ec,(float *)&OneMinusEpsilon);
          fVar12 = *in_stack_fffffffffffffbf0;
          pTVar11 = &local_18;
          pfVar10 = Tuple2<pbrt::Point2,_float>::operator[](pTVar11,0);
          __x = (int)pTVar11;
          *pfVar10 = fVar12;
          uVar14 = 0;
          u_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffb58;
          u_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffb54;
          VVar16 = SampleCosineHemisphere(u_00);
          auVar6._8_8_ = uVar14;
          auVar6._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          local_b8 = vmovlpd_avx(auVar6);
          local_b0 = VVar16.super_Tuple3<pbrt::Vector3,_float>.z * -1.0;
          FVar20 = local_2c;
        }
        else {
          pfVar10 = Tuple2<pbrt::Point2,_float>::operator[](&local_18,0);
          local_c0 = *pfVar10 + *pfVar10;
          pfVar10 = std::min<float>(&local_c0,(float *)&OneMinusEpsilon);
          fVar12 = *pfVar10;
          pTVar11 = &local_18;
          pfVar10 = Tuple2<pbrt::Point2,_float>::operator[](pTVar11,0);
          __x = (int)pTVar11;
          *pfVar10 = fVar12;
          local_d8 = local_18;
          uVar14 = 0;
          u.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffb58;
          u.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffb54;
          VVar16 = SampleCosineHemisphere(u);
          local_e0 = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar7._8_8_ = uVar14;
          auVar7._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          local_e8 = vmovlpd_avx(auVar7);
          FVar20 = local_2c;
          local_cc = local_e8;
          local_c4 = local_e0;
          local_b8 = local_e8;
          local_b0 = local_e0;
        }
        fVar12 = local_b0;
        std::abs(__x);
        FVar13 = CosineHemispherePDF(fVar12);
        local_bc = FVar13 / 2.0;
        local_2c = FVar20;
      }
      if ((local_bc != 0.0) || (NAN(local_bc))) {
        v_00 = (LightLeSample *)
               pstd::optional<pbrt::ShapeSample>::operator->
                         ((optional<pbrt::ShapeSample> *)0x6be5b5);
        z.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffb80;
        z.super_Tuple3<pbrt::Normal3,_float>._0_8_ = in_stack_fffffffffffffb78;
        Frame::FromZ(z);
        this_01 = (LightLeSample *)0x0;
        v.super_Tuple3<pbrt::Vector3,_float>.y = local_2c;
        v.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffc68;
        v.super_Tuple3<pbrt::Vector3,_float>.z = fVar21;
        TVar17 = (Tuple3<pbrt::Vector3,_float>)Frame::FromLocal((Frame *)pSVar9,v);
        local_b0 = TVar17.z;
        uVar14 = 0;
        auVar4._8_8_ = this_01;
        auVar4._0_8_ = TVar17._0_8_;
        local_b8 = vmovlpd_avx(auVar4);
        PVar18 = Interaction::p((Interaction *)
                                CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
        FVar20 = (Float)uVar14;
        FVar13 = (Float)((ulong)uVar14 >> 0x20);
        auVar3._8_4_ = FVar20;
        auVar3._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar3._12_4_ = FVar13;
        vmovlpd_avx(auVar3);
        uVar14 = 0;
        uVar15 = 0;
        SVar19 = L(in_stack_fffffffffffffcc8,(Point3f)in_stack_fffffffffffffd28,
                   (Normal3f)in_stack_fffffffffffffd08,(Point2f)in_stack_fffffffffffffcf0,
                   (Vector3f)in_stack_fffffffffffffce4,in_stack_fffffffffffffcc0);
        uStack_4b0 = (undefined4)uVar14;
        auVar1._8_8_ = uVar15;
        auVar1._0_8_ = SVar19.values.values._8_8_;
        auVar2._8_4_ = uStack_4b0;
        auVar2._0_8_ = SVar19.values.values._0_8_;
        auVar2._12_4_ = (int)((ulong)uVar14 >> 0x20);
        vmovlpd_avx(auVar2);
        vmovlpd_avx(auVar1);
        VVar16.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffbf8;
        VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffffbf0;
        Interaction::SpawnRay(in_stack_fffffffffffffbd8,VVar16);
        this_00 = (optional<pbrt::LightLeSample> *)
                  pstd::optional<pbrt::ShapeSample>::operator->
                            ((optional<pbrt::ShapeSample> *)0x6be8e8);
        LightLeSample::LightLeSample
                  (this_01,TVar17._0_8_,(Ray *)CONCAT44(TVar17.z,in_stack_fffffffffffffb80),
                   in_stack_fffffffffffffb78,FVar13,FVar20);
        pstd::optional<pbrt::LightLeSample>::optional(this_00,v_00);
        LightLeSample::~LightLeSample((LightLeSample *)0x6be949);
      }
      else {
        memset(in_RDI,0,0xa0);
        pstd::optional<pbrt::LightLeSample>::optional(in_RDI);
      }
    }
  }
  else {
    memset(in_RDI,0,0xa0);
    pstd::optional<pbrt::LightLeSample>::optional(in_RDI);
  }
  local_a8 = 1;
  pstd::optional<pbrt::ShapeSample>::~optional((optional<pbrt::ShapeSample> *)0x6be986);
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU pstd::optional<LightLeSample> DiffuseAreaLight::SampleLe(Point2f u1, Point2f u2,
                                                         SampledWavelengths &lambda,
                                                         Float time) const {
    // Sample a point on the area light's _Shape_
    pstd::optional<ShapeSample> ss = shape.Sample(u1);
    if (!ss)
        return {};
    ss->intr.time = time;
    ss->intr.mediumInterface = &mediumInterface;

    // Check sampled point on shape against alpha texture, if present
    if (AlphaMasked(ss->intr))
        return {};

    // Sample a cosine-weighted outgoing direction _w_ for area light
    Vector3f w;
    Float pdfDir;
    if (twoSided) {
        // Choose side of surface and sample cosine-weighted outgoing direction
        if (u2[0] < 0.5f) {
            u2[0] = std::min(u2[0] * 2, OneMinusEpsilon);
            w = SampleCosineHemisphere(u2);
        } else {
            u2[0] = std::min((u2[0] - 0.5f) * 2, OneMinusEpsilon);
            w = SampleCosineHemisphere(u2);
            w.z *= -1;
        }
        pdfDir = CosineHemispherePDF(std::abs(w.z)) / 2;

    } else {
        w = SampleCosineHemisphere(u2);
        pdfDir = CosineHemispherePDF(w.z);
    }
    if (pdfDir == 0)
        return {};

    // Return _LightLeSample_ for ray leaving area light
    const Interaction &intr = ss->intr;
    Frame nFrame = Frame::FromZ(intr.n);
    w = nFrame.FromLocal(w);
    SampledSpectrum Le = L(intr.p(), intr.n, intr.uv, w, lambda);
    return LightLeSample(Le, intr.SpawnRay(w), intr, ss->pdf, pdfDir);
}